

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O0

void __thiscall
ScriptBuilder_StringBuildByOperator_Test::TestBody(ScriptBuilder_StringBuildByOperator_Test *this)

{
  bool bVar1;
  ScriptBuilder *pSVar2;
  char *pcVar3;
  char *pcVar4;
  AssertHelper local_848;
  Message local_840;
  string local_838 [32];
  undefined1 local_818 [8];
  AssertionResult gtest_ar_7;
  Message local_800;
  string local_7f8 [32];
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_6;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748 [32];
  ScriptBuilder local_728;
  Script local_708;
  AssertHelper local_6d0;
  Message local_6c8;
  string local_6c0 [32];
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_5;
  Message local_688;
  string local_680 [32];
  undefined1 local_660 [8];
  AssertionResult gtest_ar_4;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [32];
  ByteData256 local_5d8;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [32];
  ScriptBuilder local_4a8;
  Script local_488;
  allocator local_449;
  string local_448 [8];
  string expect_asm;
  string local_420 [8];
  string expect_hex;
  Message local_3f8;
  string local_3f0 [32];
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_3;
  Message local_3b8;
  string local_3b0 [32];
  undefined1 local_390 [8];
  AssertionResult gtest_ar_2;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  ScriptBuilder local_1f0;
  Script local_1d0;
  AssertHelper local_198;
  Message local_190;
  string local_188 [32];
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  string local_148 [32];
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  ScriptBuilder local_68;
  undefined1 local_48 [8];
  Script script;
  ScriptBuilder_StringBuildByOperator_Test *this_local;
  
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ScriptBuilder::ScriptBuilder(&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"5",&local_89);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(&local_68,local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"2",&local_c1);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"OP_ADD",&local_e9);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,"OP_CHECKSIG",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::ScriptBuilder::operator<<(pSVar2,local_110);
  cfd::core::ScriptBuilder::Build();
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_68);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_128,"script.GetHex().c_str()","\"555293ac\"",pcVar3,"555293ac");
  std::__cxx11::string::~string(local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x11d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"script.ToString().c_str()","\"5 2 OP_ADD OP_CHECKSIG\"",pcVar3,
             "5 2 OP_ADD OP_CHECKSIG");
  std::__cxx11::string::~string(local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"0",&local_211);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(&local_1f0,local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"17",&local_239);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"8738",&local_261);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"3355443",&local_289);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"17476",&local_2b1);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"85",&local_2d9);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"26214",&local_301);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"7829367",&local_329);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"-2184",&local_351);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"-25",(allocator *)((long)&gtest_ar_2.message_.ptr_ + 7));
  cfd::core::ScriptBuilder::operator<<(pSVar2,local_378);
  cfd::core::ScriptBuilder::Build();
  cfd::core::Script::operator=((Script *)local_48,&local_1d0);
  cfd::core::Script::~Script(&local_1d0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_1f0);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_390,"script.GetHex().c_str()",
             "\"000111022222033333330244440155026666037777770288880199\"",pcVar3,
             "000111022222033333330244440155026666037777770288880199");
  std::__cxx11::string::~string(local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d0,"script.ToString().c_str()",
             "\"0 17 8738 3355443 17476 85 26214 7829367 -2184 -25\"",pcVar3,
             "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");
  std::__cxx11::string::~string(local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&expect_hex.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&expect_hex.field_2 + 8),&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&expect_hex.field_2 + 8));
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_420,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac"
             ,(allocator *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_448,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG"
             ,&local_449);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4c8,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,&local_4c9);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(&local_4a8,local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4f0,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,&local_4f1);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"144",&local_519);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"OP_CHECKLOCKTIMEVERIFY",&local_541);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"OP_DROP",&local_569);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"1469272661",&local_591);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"OP_SHA256",&local_5b9);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5f8,"f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4",&local_5f9
            );
  cfd::core::ByteData256::ByteData256(&local_5d8,local_5f8);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,&local_5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"OP_EQUALVERIFY",&local_621);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_648,"OP_CHECKSIG",(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7));
  cfd::core::ScriptBuilder::operator<<(pSVar2,local_648);
  cfd::core::ScriptBuilder::Build();
  cfd::core::Script::operator=((Script *)local_48,&local_488);
  cfd::core::Script::~Script(&local_488);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  cfd::core::ByteData256::~ByteData256(&local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_4a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_660,"script.GetHex().c_str()","expect_hex.c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_680);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x135,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6a0,"script.ToString().c_str()","expect_asm.c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x136,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"0x00",&local_749);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(&local_728,local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"0x11",&local_771);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"0x2222",&local_799);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,local_798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7c0,"0x333333",(allocator *)((long)&gtest_ar_6.message_.ptr_ + 7));
  cfd::core::ScriptBuilder::operator<<(pSVar2,local_7c0);
  cfd::core::ScriptBuilder::Build();
  cfd::core::Script::operator=((Script *)local_48,&local_708);
  cfd::core::Script::~Script(&local_708);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_6.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_728);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7d8,"script.GetHex().c_str()","\"0100011102222203333333\"",pcVar3,
             "0100011102222203333333");
  std::__cxx11::string::~string(local_7f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_818,"script.ToString().c_str()","\"0 17 8738 3355443\"",pcVar3,
             "0 17 8738 3355443");
  std::__cxx11::string::~string(local_838);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_420);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(ScriptBuilder, StringBuildByOperator) {
  Script script = (ScriptBuilder() << "5" << "2" << "OP_ADD" << "OP_CHECKSIG").Build();
  EXPECT_STREQ(script.GetHex().c_str(), "555293ac");
  EXPECT_STREQ(script.ToString().c_str(), "5 2 OP_ADD OP_CHECKSIG");

  script = (ScriptBuilder() << "0" << "17" << "8738"
     << "3355443" << "17476" << "85" << "26214" << "7829367"
     << "-2184" << "-25").Build();
  EXPECT_STREQ(script.GetHex().c_str(),
    "000111022222033333330244440155026666037777770288880199");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG";// NOLINT

  script = (ScriptBuilder()
     << "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
     << "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
     << "144"
     << "OP_CHECKLOCKTIMEVERIFY" << "OP_DROP" << "1469272661"
     << "OP_SHA256"
     << ByteData256("f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4")
     << "OP_EQUALVERIFY" << "OP_CHECKSIG").Build();
  EXPECT_STREQ(script.GetHex().c_str(), expect_hex.c_str());
  EXPECT_STREQ(script.ToString().c_str(), expect_asm.c_str());

  // hex test
  script = (ScriptBuilder()
     << "0x00"
     << "0x11"
     << "0x2222"
     << "0x333333").Build();
  EXPECT_STREQ(script.GetHex().c_str(),
    "0100011102222203333333");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443");
}